

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_crypto.cpp
# Opt level: O1

void __thiscall
duckdb::ParquetEncryptionConfig::ParquetEncryptionConfig
          (ParquetEncryptionConfig *this,ClientContext *context,Value *arg)

{
  pointer pcVar1;
  int iVar2;
  ParquetKeys *pPVar3;
  ulong uVar4;
  const_reference pvVar5;
  const_reference pvVar6;
  long *plVar7;
  const_iterator cVar8;
  string *this_00;
  BinderException *pBVar9;
  char *pcVar10;
  ulong __n;
  string footer_key_name;
  string local_110 [2];
  ClientContext *local_d0;
  vector<duckdb::Value,_true> *local_c8;
  key_type local_c0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_a0;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
  *local_98;
  Value *local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  LogicalType local_48 [24];
  
  (this->footer_key)._M_dataplus._M_p = (pointer)&(this->footer_key).field_2;
  (this->footer_key)._M_string_length = 0;
  (this->footer_key).field_2._M_local_buf[0] = '\0';
  (this->column_keys)._M_h._M_buckets = &(this->column_keys)._M_h._M_single_bucket;
  (this->column_keys)._M_h._M_bucket_count = 1;
  (this->column_keys)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->column_keys)._M_h._M_element_count = 0;
  (this->column_keys)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->column_keys)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->column_keys)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_d0 = context;
  if (*arg != (Value)0x64) {
    pBVar9 = (BinderException *)__cxa_allocate_exception(0x10);
    local_110[0]._M_dataplus._M_p = (pointer)&local_110[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_110,"Parquet encryption_config must be of type STRUCT","");
    duckdb::BinderException::BinderException(pBVar9,(string *)local_110);
    __cxa_throw(pBVar9,&BinderException::typeinfo,std::runtime_error::~runtime_error);
  }
  local_98 = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
              *)duckdb::StructType::GetChildTypes_abi_cxx11_((LogicalType *)arg);
  local_c8 = (vector<duckdb::Value,_true> *)duckdb::StructValue::GetChildren(arg);
  local_90 = arg;
  pPVar3 = ParquetKeys::Get(local_d0);
  local_a0 = &(pPVar3->keys)._M_h;
  __n = 0;
  this_00 = local_110;
  do {
    uVar4 = duckdb::StructType::GetChildCount((LogicalType *)local_90);
    if (uVar4 <= __n) {
      return;
    }
    pvVar5 = vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
             ::operator[](local_98,__n);
    duckdb::StringUtil::Lower((string *)this_00);
    iVar2 = std::__cxx11::string::compare((char *)this_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110[0]._M_dataplus._M_p != &local_110[0].field_2) {
      operator_delete(local_110[0]._M_dataplus._M_p);
    }
    if (iVar2 == 0) {
      pvVar5 = (const_reference)vector<duckdb::Value,_true>::operator[](local_c8,__n);
      duckdb::LogicalType::LogicalType(local_48,VARCHAR);
      duckdb::Value::DefaultCastAs((LogicalType *)this_00,SUB81(pvVar5,0));
      plVar7 = (long *)duckdb::StringValue::Get_abi_cxx11_((Value *)this_00);
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_c0,*plVar7,plVar7[1] + *plVar7);
      duckdb::Value::~Value((Value *)this_00);
      duckdb::LogicalType::~LogicalType(local_48);
      cVar8 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(local_a0,&local_c0);
      if (cVar8.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        pBVar9 = (BinderException *)__cxa_allocate_exception(0x10);
        local_110[0]._M_dataplus._M_p = (pointer)&local_110[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_110,
                   "No key with name \"%s\" exists. Add it with PRAGMA add_parquet_key(\'<key_name>\',\'<key>\');"
                   ,"");
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_68,local_c0._M_dataplus._M_p,
                   local_c0._M_dataplus._M_p + local_c0._M_string_length);
        BinderException::BinderException<std::__cxx11::string>(pBVar9,local_110,&local_68);
        __cxa_throw(pBVar9,&BinderException::typeinfo,std::runtime_error::~runtime_error);
      }
      pPVar3 = ParquetKeys::Get(local_d0);
      cVar8 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(pPVar3->keys)._M_h,&local_c0);
      if (cVar8.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        pcVar10 = anon_var_dwarf_1305cc;
        local_110[0]._M_dataplus._M_p = (pointer)std::__throw_out_of_range(anon_var_dwarf_1305cc);
        goto LAB_00272881;
      }
      std::__cxx11::string::_M_assign((string *)this);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p);
      }
    }
    else {
      duckdb::StringUtil::Lower((string *)this_00);
      iVar2 = std::__cxx11::string::compare((char *)this_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110[0]._M_dataplus._M_p != &local_110[0].field_2) {
        operator_delete(local_110[0]._M_dataplus._M_p);
      }
      if (iVar2 != 0) {
        duckdb::StringUtil::Lower((string *)local_110);
        iVar2 = std::__cxx11::string::compare((char *)local_110);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110[0]._M_dataplus._M_p != &local_110[0].field_2) {
          operator_delete(local_110[0]._M_dataplus._M_p);
        }
        this_00 = (string *)__cxa_allocate_exception(0x10);
        pcVar10 = (char *)local_110;
        local_110[0]._M_dataplus._M_p = (pointer)&local_110[0].field_2;
        if (iVar2 == 0) {
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)pcVar10,"Parquet encryption_config column_keys not yet implemented",
                     "");
          duckdb::NotImplementedException::NotImplementedException
                    ((NotImplementedException *)this_00,(string *)local_110);
          __cxa_throw(this_00,&NotImplementedException::typeinfo,std::runtime_error::~runtime_error)
          ;
        }
LAB_00272881:
        (((string *)pcVar10)->_M_dataplus)._M_p = local_110[0]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char_const*>();
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        pcVar1 = (pvVar5->first)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_88,pcVar1,pcVar1 + (pvVar5->first)._M_string_length);
        BinderException::BinderException<std::__cxx11::string>
                  ((BinderException *)this_00,local_110,&local_88);
        __cxa_throw(this_00,&BinderException::typeinfo,std::runtime_error::~runtime_error);
      }
      pvVar6 = vector<duckdb::Value,_true>::operator[](local_c8,__n);
      duckdb::LogicalType::LogicalType((LogicalType *)&local_c0,BLOB);
      duckdb::Value::DefaultCastAs((LogicalType *)this_00,SUB81(pvVar6,0));
      duckdb::StringValue::Get_abi_cxx11_((Value *)this_00);
      std::__cxx11::string::_M_assign((string *)this);
      duckdb::Value::~Value((Value *)this_00);
      duckdb::LogicalType::~LogicalType((LogicalType *)&local_c0);
    }
    __n = __n + 1;
  } while( true );
}

Assistant:

ParquetEncryptionConfig::ParquetEncryptionConfig(ClientContext &context, const Value &arg) {
	if (arg.type().id() != LogicalTypeId::STRUCT) {
		throw BinderException("Parquet encryption_config must be of type STRUCT");
	}
	const auto &child_types = StructType::GetChildTypes(arg.type());
	auto &children = StructValue::GetChildren(arg);
	const auto &keys = ParquetKeys::Get(context);
	for (idx_t i = 0; i < StructType::GetChildCount(arg.type()); i++) {
		auto &struct_key = child_types[i].first;
		if (StringUtil::Lower(struct_key) == "footer_key") {
			const auto footer_key_name = StringValue::Get(children[i].DefaultCastAs(LogicalType::VARCHAR));
			if (!keys.HasKey(footer_key_name)) {
				throw BinderException(
				    "No key with name \"%s\" exists. Add it with PRAGMA add_parquet_key('<key_name>','<key>');",
				    footer_key_name);
			}
			// footer key name provided - read the key from the config
			const auto &keys = ParquetKeys::Get(context);
			footer_key = keys.GetKey(footer_key_name);
		} else if (StringUtil::Lower(struct_key) == "footer_key_value") {
			footer_key = StringValue::Get(children[i].DefaultCastAs(LogicalType::BLOB));
		} else if (StringUtil::Lower(struct_key) == "column_keys") {
			throw NotImplementedException("Parquet encryption_config column_keys not yet implemented");
		} else {
			throw BinderException("Unknown key in encryption_config \"%s\"", struct_key);
		}
	}
}